

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xunit.h
# Opt level: O2

string * __thiscall
bandit::reporter::xunit::escape(string *__return_storage_ptr__,xunit *this,string *str)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  char *pcVar4;
  size_type sVar5;
  stringstream stm;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pcVar2 = (str->_M_dataplus)._M_p;
  sVar3 = str->_M_string_length;
  sVar5 = 0;
  do {
    if (sVar3 == sVar5) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_1b8);
      return __return_storage_ptr__;
    }
    cVar1 = pcVar2[sVar5];
    if (cVar1 == '\"') {
      pcVar4 = "&quot;";
LAB_00108c79:
      std::operator<<(local_1a8,pcVar4);
    }
    else {
      if (cVar1 == '\\') {
        pcVar4 = "&apos;";
        goto LAB_00108c79;
      }
      pcVar4 = "&lt;";
      if (cVar1 == '<') goto LAB_00108c79;
      if (cVar1 == '>') {
        pcVar4 = "&gt;";
        goto LAB_00108c79;
      }
      if (cVar1 == '&') {
        pcVar4 = "&amp;";
        goto LAB_00108c79;
      }
      std::operator<<(local_1a8,cVar1);
    }
    sVar5 = sVar5 + 1;
  } while( true );
}

Assistant:

std::string escape(const std::string& str) {
        std::stringstream stm;

        for (char c : str) {
          switch (c) {
          case '&':
            stm << "&amp;";
            break;
          case '<':
            stm << "&lt;";
            break;
          case '>':
            stm << "&gt;";
            break;
          case '\\':
            stm << "&apos;";
            break;
          case '\"':
            stm << "&quot;";
            break;
          default:
            stm << c;
          }
        }

        return stm.str();
      }